

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compositecodec.h
# Opt level: O0

string * __thiscall
FastPForLib::
CompositeCodec<FastPForLib::OPTPFor<4u,FastPForLib::Simple16<false>>,FastPForLib::VariableByte>::
name_abi_cxx11_(CompositeCodec<FastPForLib::OPTPFor<4U,_FastPForLib::Simple16<false>_>,_FastPForLib::VariableByte>
                *this)

{
  ostream *poVar1;
  string *in_RDI;
  ostringstream convert;
  VariableByte *in_stack_fffffffffffffe28;
  string local_1a8 [32];
  ostringstream local_188 [352];
  OPTPFor<4U,_FastPForLib::Simple16<false>_> *in_stack_ffffffffffffffd8;
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  OPTPFor<4u,FastPForLib::Simple16<false>>::name_abi_cxx11_(in_stack_ffffffffffffffd8);
  poVar1 = std::operator<<((ostream *)local_188,local_1a8);
  poVar1 = std::operator<<(poVar1,"+");
  VariableByte::name_abi_cxx11_(in_stack_fffffffffffffe28);
  std::operator<<(poVar1,(string *)&stack0xfffffffffffffe28);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe28);
  std::__cxx11::string::~string(local_1a8);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

std::string name() const override {
    std::ostringstream convert;
    convert << codec1.name() << "+" << codec2.name();
    return convert.str();
  }